

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeMemberDebugType(Builder *this,Id memberType,DebugTypeLoc *debugTypeLoc)

{
  Id IVar1;
  Id typeId;
  mapped_type_conflict *pmVar2;
  Instruction *pIVar3;
  mapped_type *this_00;
  value_type local_38;
  key_type local_2c;
  Instruction *local_28;
  Instruction *type;
  DebugTypeLoc *debugTypeLoc_local;
  Builder *pBStack_10;
  Id memberType_local;
  Builder *this_local;
  
  type = (Instruction *)debugTypeLoc;
  debugTypeLoc_local._4_4_ = memberType;
  pBStack_10 = this;
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,(key_type *)((long)&debugTypeLoc_local + 4));
  if (*pmVar2 != 0) {
    pIVar3 = (Instruction *)::operator_new(0x60);
    IVar1 = getUniqueId(this);
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(pIVar3,IVar1,typeId,OpExtInst);
    local_28 = pIVar3;
    spv::Instruction::reserveOperands(pIVar3,10);
    spv::Instruction::addIdOperand(local_28,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_28,0xb);
    pIVar3 = local_28;
    IVar1 = getStringId(this,(string *)type);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,(key_type *)((long)&debugTypeLoc_local + 4));
    spv::Instruction::addIdOperand(pIVar3,*pmVar2);
    pIVar3 = local_28;
    IVar1 = makeDebugSource(this,this->currentFileId);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    IVar1 = makeUintConstant(this,*(uint *)&(type->operands).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    IVar1 = makeUintConstant(this,*(uint *)((long)&(type->operands).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 4),
                             false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    IVar1 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    IVar1 = makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = local_28;
    IVar1 = makeUintConstant(this,3,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_2c = 0xb;
    this_00 = std::
              unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
              ::operator[](&this->groupedDebugTypes,&local_2c);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (this_00,&local_28);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
               local_28);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_38);
    Module::mapInstruction(&this->module,local_28);
    IVar1 = spv::Instruction::getResultId(local_28);
    return IVar1;
  }
  __assert_fail("debugId[memberType] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x3fa,"Id spv::Builder::makeMemberDebugType(const Id, const DebugTypeLoc &)");
}

Assistant:

Id Builder::makeMemberDebugType(Id const memberType, DebugTypeLoc const& debugTypeLoc)
{
    assert(debugId[memberType] != 0);

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(10);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeMember);
    type->addIdOperand(getStringId(debugTypeLoc.name)); // name id
    type->addIdOperand(debugId[memberType]); // type id
    type->addIdOperand(makeDebugSource(currentFileId)); // source id
    type->addIdOperand(makeUintConstant(debugTypeLoc.line)); // line id TODO: currentLine is always zero
    type->addIdOperand(makeUintConstant(debugTypeLoc.column)); // TODO: column id
    type->addIdOperand(makeUintConstant(0)); // TODO: offset id
    type->addIdOperand(makeUintConstant(0)); // TODO: size id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMember].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}